

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int test_aes128_cmac_prf(int verbose)

{
  uchar auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [11];
  undefined1 auVar5 [12];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  int iVar8;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  uchar uStack_28;
  uchar uStack_27;
  uchar uStack_26;
  uchar uStack_25;
  uchar uStack_24;
  uchar uStack_23;
  uchar uStack_22;
  uchar uStack_21;
  uchar output [16];
  int ret;
  int i;
  int verbose_local;
  int iVar9;
  
  output[8] = 0x92;
  output[9] = 0xff;
  output[10] = 0xff;
  output[0xb] = 0xff;
  output[0xc] = '\0';
  output[0xd] = '\0';
  output[0xe] = '\0';
  output[0xf] = '\0';
  while( true ) {
    if (2 < (int)output._12_4_) {
      iVar8._0_1_ = output[8];
      iVar8._1_1_ = output[9];
      iVar8._2_1_ = output[10];
      iVar8._3_1_ = output[0xb];
      return iVar8;
    }
    printf("  AES CMAC 128 PRF #%u: ",(ulong)(uint)output._12_4_);
    output._8_4_ = mbedtls_aes_cmac_prf_128("",PRFKlen[(int)output._12_4_],"",0x14,&uStack_28);
    if (output._8_4_ != 0) break;
    auVar1 = PRFT[(int)output._12_4_];
    cVar10 = -(uStack_28 == auVar1[0]);
    cVar11 = -(uStack_27 == auVar1[1]);
    cVar12 = -(uStack_26 == auVar1[2]);
    cVar13 = -(uStack_25 == auVar1[3]);
    cVar14 = -(uStack_24 == auVar1[4]);
    cVar15 = -(uStack_23 == auVar1[5]);
    cVar16 = -(uStack_22 == auVar1[6]);
    cVar17 = -(uStack_21 == auVar1[7]);
    cVar18 = -(output[0] == auVar1[8]);
    cVar19 = -(output[1] == auVar1[9]);
    cVar20 = -(output[2] == auVar1[10]);
    cVar21 = -(output[3] == auVar1[0xb]);
    cVar22 = -(output[4] == auVar1[0xc]);
    cVar23 = -(output[5] == auVar1[0xd]);
    cVar24 = -(output[6] == auVar1[0xe]);
    bVar25 = -(output[7] == auVar1[0xf]);
    auVar2[1] = cVar11;
    auVar2[0] = cVar10;
    auVar2[2] = cVar12;
    auVar2[3] = cVar13;
    auVar2[4] = cVar14;
    auVar2[5] = cVar15;
    auVar2[6] = cVar16;
    auVar2[7] = cVar17;
    auVar2[8] = cVar18;
    auVar2[9] = cVar19;
    auVar2[10] = cVar20;
    auVar2[0xb] = cVar21;
    auVar2[0xc] = cVar22;
    auVar2[0xd] = cVar23;
    auVar2[0xe] = cVar24;
    auVar2[0xf] = bVar25;
    auVar3[1] = cVar11;
    auVar3[0] = cVar10;
    auVar3[2] = cVar12;
    auVar3[3] = cVar13;
    auVar3[4] = cVar14;
    auVar3[5] = cVar15;
    auVar3[6] = cVar16;
    auVar3[7] = cVar17;
    auVar3[8] = cVar18;
    auVar3[9] = cVar19;
    auVar3[10] = cVar20;
    auVar3[0xb] = cVar21;
    auVar3[0xc] = cVar22;
    auVar3[0xd] = cVar23;
    auVar3[0xe] = cVar24;
    auVar3[0xf] = bVar25;
    auVar7[1] = cVar13;
    auVar7[0] = cVar12;
    auVar7[2] = cVar14;
    auVar7[3] = cVar15;
    auVar7[4] = cVar16;
    auVar7[5] = cVar17;
    auVar7[6] = cVar18;
    auVar7[7] = cVar19;
    auVar7[8] = cVar20;
    auVar7[9] = cVar21;
    auVar7[10] = cVar22;
    auVar7[0xb] = cVar23;
    auVar7[0xc] = cVar24;
    auVar7[0xd] = bVar25;
    auVar6[1] = cVar14;
    auVar6[0] = cVar13;
    auVar6[2] = cVar15;
    auVar6[3] = cVar16;
    auVar6[4] = cVar17;
    auVar6[5] = cVar18;
    auVar6[6] = cVar19;
    auVar6[7] = cVar20;
    auVar6[8] = cVar21;
    auVar6[9] = cVar22;
    auVar6[10] = cVar23;
    auVar6[0xb] = cVar24;
    auVar6[0xc] = bVar25;
    auVar5[1] = cVar15;
    auVar5[0] = cVar14;
    auVar5[2] = cVar16;
    auVar5[3] = cVar17;
    auVar5[4] = cVar18;
    auVar5[5] = cVar19;
    auVar5[6] = cVar20;
    auVar5[7] = cVar21;
    auVar5[8] = cVar22;
    auVar5[9] = cVar23;
    auVar5[10] = cVar24;
    auVar5[0xb] = bVar25;
    auVar4[1] = cVar16;
    auVar4[0] = cVar15;
    auVar4[2] = cVar17;
    auVar4[3] = cVar18;
    auVar4[4] = cVar19;
    auVar4[5] = cVar20;
    auVar4[6] = cVar21;
    auVar4[7] = cVar22;
    auVar4[8] = cVar23;
    auVar4[9] = cVar24;
    auVar4[10] = bVar25;
    if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar7 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar6 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar5 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar4 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar25,CONCAT18(cVar24,CONCAT17(cVar23,CONCAT16(cVar22,
                                                  CONCAT15(cVar21,CONCAT14(cVar20,CONCAT13(cVar19,
                                                  CONCAT12(cVar18,CONCAT11(cVar17,cVar16))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar25,CONCAT17(cVar24,CONCAT16(cVar23,CONCAT15(cVar22,
                                                  CONCAT14(cVar21,CONCAT13(cVar20,CONCAT12(cVar19,
                                                  CONCAT11(cVar18,cVar17)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar25 >> 7) << 0xf) != 0xffff) break;
    if (verbose != 0) {
      printf("passed\n");
    }
    output._12_4_ = output._12_4_ + 1;
  }
  if (verbose != 0) {
    printf("failed\n");
  }
  iVar9._0_1_ = output[8];
  iVar9._1_1_ = output[9];
  iVar9._2_1_ = output[10];
  iVar9._3_1_ = output[0xb];
  return iVar9;
}

Assistant:

static int test_aes128_cmac_prf( int verbose )
{
    int i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char output[MBEDTLS_AES_BLOCK_SIZE];

    for( i = 0; i < NB_PRF_TESTS; i++ )
    {
        mbedtls_printf( "  AES CMAC 128 PRF #%u: ", i );
        ret = mbedtls_aes_cmac_prf_128( PRFK, PRFKlen[i], PRFM, 20, output );
        if( ret != 0 ||
            memcmp( output, PRFT[i], MBEDTLS_AES_BLOCK_SIZE ) != 0 )
        {

            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( ret );
        }
        else if( verbose != 0 )
        {
            mbedtls_printf( "passed\n" );
        }
    }
    return( ret );
}